

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isConformantSchemeName(XMLCh *scheme,XMLSize_t schemeLen)

{
  bool bVar1;
  int iVar2;
  ulong local_28;
  XMLSize_t i;
  XMLSize_t schemeLen_local;
  XMLCh *scheme_local;
  
  bVar1 = XMLString::isAlpha(*scheme);
  if (bVar1) {
    for (local_28 = 1; local_28 < schemeLen; local_28 = local_28 + 1) {
      bVar1 = XMLString::isAlphaNum(scheme[local_28]);
      if ((!bVar1) && (iVar2 = XMLString::indexOf(L"+-.",scheme[local_28]), iVar2 == -1)) {
        return false;
      }
    }
    scheme_local._7_1_ = true;
  }
  else {
    scheme_local._7_1_ = false;
  }
  return scheme_local._7_1_;
}

Assistant:

bool XMLUri::isConformantSchemeName( const XMLCh* const scheme
                                   , const XMLSize_t schemeLen)
{
    if (!XMLString::isAlpha(*scheme))     // first: alpha
        return false;

    // second onwards: ( alpha | digit | "+" | "-" | "." )
    for (XMLSize_t i=1; i<schemeLen; i++)
    {
        if ( !XMLString::isAlphaNum(scheme[i]) &&
             (XMLString::indexOf(SCHEME_CHARACTERS, scheme[i]) == -1))
            return false;
    }

    return true;
}